

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
SBarInfoCommandFlowControl::ParseBlock
          (SBarInfoCommandFlowControl *this,
          TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *commands,FScanner *sc,
          bool fullScreenOffsets)

{
  bool bVar1;
  SBarInfoCommand *local_38;
  SBarInfoCommand *cmd_1;
  SBarInfoCommand *cmd;
  FScanner *pFStack_20;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *commands_local;
  SBarInfoCommandFlowControl *this_local;
  
  cmd._7_1_ = fullScreenOffsets;
  pFStack_20 = sc;
  sc_local = (FScanner *)commands;
  commands_local = (TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *)this;
  bVar1 = FScanner::CheckToken(sc,0x7b);
  if (bVar1) {
    while (cmd_1 = NextCommand(this,pFStack_20), cmd_1 != (SBarInfoCommand *)0x0) {
      (*cmd_1->_vptr_SBarInfoCommand[3])(cmd_1,pFStack_20,(ulong)(cmd._7_1_ & 1));
      TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Push
                ((TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *)sc_local,&cmd_1);
    }
  }
  else {
    local_38 = NextCommand(this,pFStack_20);
    if (local_38 == (SBarInfoCommand *)0x0) {
      FScanner::ScriptError(pFStack_20,"Missing command for flow control statement.");
    }
    else {
      (*local_38->_vptr_SBarInfoCommand[3])(local_38,pFStack_20,(ulong)(cmd._7_1_ & 1));
      TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Push
                ((TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *)sc_local,&local_38);
    }
  }
  return;
}

Assistant:

void ParseBlock(TDeletingArray<SBarInfoCommand *> &commands, FScanner &sc, bool fullScreenOffsets)
		{
			if(sc.CheckToken('{'))
			{
				while(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
			}
			else
			{
				if(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
				else
					sc.ScriptError("Missing command for flow control statement.");
			}
		}